

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initFormFiles(VcprojGenerator *this)

{
  long lVar1;
  long in_RDI;
  QString *this_00;
  long in_FS_OFFSET;
  ProKey *in_stack_ffffffffffffff98;
  QMakeProject *this_01;
  VCFilter *this_02;
  Data *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QString *)(in_RDI + 0x2a78);
  QString::operator=(this_00,(char *)in_stack_ffffffffffffffc8);
  *(undefined4 *)(in_RDI + 0x2ac0) = 0;
  QString::operator=(this_00,(char *)in_stack_ffffffffffffffc8);
  QString::operator=(this_00,(char *)in_stack_ffffffffffffffc8);
  this_01 = *(QMakeProject **)(in_RDI + 0xd8);
  this_02 = (VCFilter *)&stack0xffffffffffffffc8;
  ProKey::ProKey((ProKey *)this_01,(char *)in_stack_ffffffffffffff98);
  QMakeProject::values(this_01,in_stack_ffffffffffffff98);
  VCFilter::addFiles(this_02,(ProStringList *)this_00);
  ProKey::~ProKey((ProKey *)0x293094);
  *(long *)(in_RDI + 0x2ac8) = in_RDI;
  *(long *)(in_RDI + 0x2ad0) = in_RDI + 0x268;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initFormFiles()
{
    vcProject.FormFiles.Name = "Form Files";
    vcProject.FormFiles.ParseFiles = _False;
    vcProject.FormFiles.Filter = "ui";
    vcProject.FormFiles.Guid = _GUIDFormFiles;
    vcProject.FormFiles.addFiles(project->values("FORMS"));
    vcProject.FormFiles.Project = this;
    vcProject.FormFiles.Config = &(vcProject.Configuration);
}